

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_discard.c
# Opt level: O0

void zip_discard(zip_t *za)

{
  ulong local_18;
  zip_uint64_t i;
  zip_t *za_local;
  
  if (za != (zip_t *)0x0) {
    if (za->src != (zip_source_t *)0x0) {
      zip_source_close(za->src);
      zip_source_free(za->src);
    }
    free(za->default_password);
    _zip_string_free(za->comment_orig);
    _zip_string_free(za->comment_changes);
    _zip_hash_free(za->names);
    if (za->entry != (zip_entry_t *)0x0) {
      for (local_18 = 0; local_18 < za->nentry; local_18 = local_18 + 1) {
        _zip_entry_finalize(za->entry + local_18);
      }
      free(za->entry);
    }
    for (local_18 = 0; local_18 < za->nopen_source; local_18 = local_18 + 1) {
      _zip_source_invalidate(za->open_source[local_18]);
    }
    free(za->open_source);
    _zip_progress_free(za->progress);
    zip_error_fini(&za->error);
    free(za);
  }
  return;
}

Assistant:

void
zip_discard(zip_t *za) {
    zip_uint64_t i;

    if (za == NULL)
	return;

    if (za->src) {
	zip_source_close(za->src);
	zip_source_free(za->src);
    }

    free(za->default_password);
    _zip_string_free(za->comment_orig);
    _zip_string_free(za->comment_changes);

    _zip_hash_free(za->names);

    if (za->entry) {
	for (i = 0; i < za->nentry; i++)
	    _zip_entry_finalize(za->entry + i);
	free(za->entry);
    }

    for (i = 0; i < za->nopen_source; i++) {
	_zip_source_invalidate(za->open_source[i]);
    }
    free(za->open_source);

    _zip_progress_free(za->progress);

    zip_error_fini(&za->error);

    free(za);

    return;
}